

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDColor.cpp
# Opt level: O3

void __thiscall EDColor::validateEdgeSegments(EDColor *this)

{
  int *piVar1;
  undefined8 uVar2;
  pointer pvVar3;
  double dVar4;
  uint uVar5;
  double *pdVar6;
  void *__s;
  long lVar7;
  pointer pvVar8;
  uchar *puVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uchar *puVar13;
  long lVar14;
  uchar *puVar15;
  int iVar16;
  uchar *puVar17;
  int iVar18;
  uchar *puVar19;
  short *psVar20;
  pointer *ppPVar21;
  uchar *puVar22;
  uchar *puVar23;
  uchar *puVar24;
  int iVar25;
  int iVar26;
  ulong uVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  uchar *puVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  Mat gradImage;
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  void *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  _InputArray local_a8;
  Mat local_90 [96];
  
  pdVar6 = (double *)operator_new__(0x40000);
  this->H = pdVar6;
  memset(pdVar6,0,0x40000);
  memset(this->edgeImg,0,(long)this->height * (long)this->width);
  memset(this->gradImg,0,(long)this->height * (long)this->width * 2);
  __s = operator_new__(0x20000);
  memset(__s,0,0x20000);
  iVar16 = this->height;
  iVar11 = this->width;
  psVar20 = this->gradImg;
  if (2 < iVar16) {
    lVar7 = (long)iVar11;
    puVar15 = this->smooth_L;
    puVar23 = this->smooth_a;
    puVar17 = this->smooth_b;
    psVar20 = psVar20 + lVar7 + 1;
    puVar19 = puVar15 + 2;
    puVar31 = puVar23 + lVar7 + 2;
    puVar13 = puVar17 + lVar7 + 2;
    puVar9 = puVar17 + lVar7 * 2 + 2;
    puVar17 = puVar17 + 2;
    puVar24 = puVar23 + lVar7 * 2 + 2;
    puVar23 = puVar23 + 2;
    puVar22 = puVar15 + lVar7 * 2 + 2;
    puVar15 = puVar15 + 2;
    uVar27 = 1;
    do {
      puVar19 = puVar19 + lVar7;
      if (2 < iVar11) {
        lVar14 = 0;
        do {
          iVar28 = ((uint)puVar19[lVar14] + ((uint)puVar15[lVar14] - (uint)puVar22[lVar14 + -2]) +
                   ((uint)puVar22[lVar14] - (uint)puVar15[lVar14 + -2])) -
                   (uint)puVar19[lVar14 + -2];
          iVar12 = -iVar28;
          if (0 < iVar28) {
            iVar12 = iVar28;
          }
          iVar18 = ((uint)puVar22[lVar14 + -1] +
                   ((uint)puVar22[lVar14] - (uint)puVar15[lVar14 + -2])) -
                   ((uint)puVar15[lVar14 + -1] +
                   ((uint)puVar15[lVar14] - (uint)puVar22[lVar14 + -2]));
          iVar28 = -iVar18;
          if (0 < iVar18) {
            iVar28 = iVar18;
          }
          iVar29 = ((uint)puVar31[lVar14] + ((uint)puVar23[lVar14] - (uint)puVar24[lVar14 + -2]) +
                   ((uint)puVar24[lVar14] - (uint)puVar23[lVar14 + -2])) -
                   (uint)puVar31[lVar14 + -2];
          iVar18 = -iVar29;
          if (0 < iVar29) {
            iVar18 = iVar29;
          }
          iVar30 = ((uint)puVar24[lVar14 + -1] +
                   ((uint)puVar24[lVar14] - (uint)puVar23[lVar14 + -2])) -
                   ((uint)puVar23[lVar14 + -1] +
                   ((uint)puVar23[lVar14] - (uint)puVar24[lVar14 + -2]));
          iVar29 = -iVar30;
          if (0 < iVar30) {
            iVar29 = iVar30;
          }
          iVar25 = ((uint)puVar13[lVar14] + ((uint)puVar17[lVar14] - (uint)puVar9[lVar14 + -2]) +
                   ((uint)puVar9[lVar14] - (uint)puVar17[lVar14 + -2])) - (uint)puVar13[lVar14 + -2]
          ;
          iVar30 = -iVar25;
          if (0 < iVar25) {
            iVar30 = iVar25;
          }
          iVar26 = ((uint)puVar9[lVar14 + -1] + ((uint)puVar9[lVar14] - (uint)puVar17[lVar14 + -2]))
                   - ((uint)puVar17[lVar14 + -1] +
                     ((uint)puVar17[lVar14] - (uint)puVar9[lVar14 + -2]));
          iVar25 = -iVar26;
          if (0 < iVar26) {
            iVar25 = iVar26;
          }
          uVar5 = (iVar25 + 2 + iVar29 + iVar18 + iVar28 + iVar12 + iVar30 & 0xffffU) / 3;
          psVar20[lVar14] = (short)uVar5;
          piVar1 = (int *)((long)__s + (ulong)uVar5 * 4);
          *piVar1 = *piVar1 + 1;
          lVar14 = lVar14 + 1;
        } while ((ulong)(iVar11 - 1) - 1 != lVar14);
      }
      uVar27 = uVar27 + 1;
      psVar20 = psVar20 + lVar7;
      puVar31 = puVar31 + lVar7;
      puVar13 = puVar13 + lVar7;
      puVar15 = puVar15 + lVar7;
      puVar23 = puVar23 + lVar7;
      puVar17 = puVar17 + lVar7;
      puVar9 = puVar9 + lVar7;
      puVar24 = puVar24 + lVar7;
      puVar22 = puVar22 + lVar7;
    } while (uVar27 != iVar16 - 1);
    iVar11 = this->width;
    psVar20 = this->gradImg;
  }
  cv::Mat::Mat(local_90,iVar16,iVar11,3,psVar20,0);
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"newGrad.pgm","");
  local_a8.sz.width = 0;
  local_a8.sz.height = 0;
  local_a8.flags = 0x1010000;
  local_b8 = 0;
  local_c8 = (void *)0x0;
  uStack_c0 = 0;
  local_a8.obj = local_90;
  cv::imwrite((string *)local_e8,&local_a8,(vector *)&local_c8);
  if (local_c8 != (void *)0x0) {
    operator_delete(local_c8);
  }
  if (local_e8[0] != local_d8) {
    operator_delete(local_e8[0]);
  }
  iVar16 = this->width;
  iVar11 = this->height;
  iVar12 = *(int *)((long)__s + 0x1fffc);
  uVar27 = 0x8000;
  do {
    iVar12 = iVar12 + *(int *)((long)__s + uVar27 * 4 + -8);
    *(int *)((long)__s + uVar27 * 4 + -8) = iVar12;
    uVar27 = uVar27 - 1;
  } while (1 < uVar27);
  pdVar6 = this->H;
  dVar4 = (double)((iVar11 + -2) * (iVar16 + -2));
  lVar7 = 0;
  do {
    uVar2 = *(undefined8 *)((long)__s + lVar7 * 4);
    auVar32._0_8_ = (double)(int)uVar2;
    auVar32._8_8_ = (double)(int)((ulong)uVar2 >> 0x20);
    auVar33._8_4_ = SUB84(dVar4,0);
    auVar33._0_8_ = dVar4;
    auVar33._12_4_ = (int)((ulong)dVar4 >> 0x20);
    auVar33 = divpd(auVar32,auVar33);
    *(undefined1 (*) [16])(pdVar6 + lVar7) = auVar33;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 0x8000);
  this->np = 0;
  pvVar8 = (this->segments).
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (this->segments).
           super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)pvVar3 - (long)pvVar8;
  if (lVar7 != 0) {
    lVar7 = (lVar7 >> 3) * -0x5555555555555555;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    ppPVar21 = &(pvVar8->super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    iVar16 = 0;
    do {
      iVar11 = (int)((ulong)((long)*ppPVar21 -
                            (long)((_Vector_impl_data *)(ppPVar21 + -1))->_M_start) >> 3);
      iVar16 = iVar16 + ((iVar11 + -1) * iVar11) / 2;
      ppPVar21 = ppPVar21 + 3;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    this->np = iVar16;
    if (pvVar3 != pvVar8) {
      lVar7 = 8;
      uVar27 = 0;
      do {
        testSegment(this,(int)uVar27,0,
                    (int)((ulong)(*(long *)((long)&(pvVar8->
                                                  super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + lVar7
                                           ) - *(long *)((long)pvVar8 + lVar7 + -8)) >> 3) + -1);
        uVar27 = uVar27 + 1;
        pvVar8 = (this->segments).
                 super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = ((long)(this->segments).
                        super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar8 >> 3) *
                 -0x5555555555555555;
        lVar7 = lVar7 + 0x18;
      } while (uVar27 <= uVar10 && uVar10 - uVar27 != 0);
      pdVar6 = this->H;
    }
    if (pdVar6 == (double *)0x0) goto LAB_00115849;
  }
  operator_delete__(pdVar6);
LAB_00115849:
  operator_delete__(__s);
  cv::Mat::~Mat(local_90);
  return;
}

Assistant:

void EDColor::validateEdgeSegments()
{
	int maxGradValue = MAX_GRAD_VALUE;
	H = new double[maxGradValue];
	memset(H, 0, sizeof(double)*maxGradValue);

	memset(edgeImg, 0, width*height); // clear edge image
	
	// Compute the gradient
	memset(gradImg, 0, sizeof(short)*width*height); // reset gradient Image pixels to zero

	int *grads = new int[maxGradValue];
	memset(grads, 0, sizeof(int)*maxGradValue);

	for (int i = 1; i<height - 1; i++) {
		for (int j = 1; j<width - 1; j++) {
			// Gradient for channel1
			int com1 = smooth_L[(i + 1)*width + j + 1] - smooth_L[(i - 1)*width + j - 1];
			int com2 = smooth_L[(i - 1)*width + j + 1] - smooth_L[(i + 1)*width + j - 1];

			int gxCh1 = abs(com1 + com2 + (smooth_L[i*width + j + 1] - smooth_L[i*width + j - 1]));
			int gyCh1 = abs(com1 - com2 + (smooth_L[(i + 1)*width + j] - smooth_L[(i - 1)*width + j]));
			int ch1Grad = gxCh1 + gyCh1;

			// Gradient for channel2
			com1 = smooth_a[(i + 1)*width + j + 1] - smooth_a[(i - 1)*width + j - 1];
			com2 = smooth_a[(i - 1)*width + j + 1] - smooth_a[(i + 1)*width + j - 1];

			int gxCh2 = abs(com1 + com2 + (smooth_a[i*width + j + 1] - smooth_a[i*width + j - 1]));
			int gyCh2 = abs(com1 - com2 + (smooth_a[(i + 1)*width + j] - smooth_a[(i - 1)*width + j]));
			int ch2Grad = gxCh2 + gyCh2;

			// Gradient for channel3
			com1 = smooth_b[(i + 1)*width + j + 1] - smooth_b[(i - 1)*width + j - 1];
			com2 = smooth_b[(i - 1)*width + j + 1] - smooth_b[(i + 1)*width + j - 1];

			int gxCh3 = abs(com1 + com2 + (smooth_b[i*width + j + 1] - smooth_b[i*width + j - 1]));
			int gyCh3 = abs(com1 - com2 + (smooth_b[(i + 1)*width + j] - smooth_b[(i - 1)*width + j]));
			int ch3Grad = gxCh3 + gyCh3;

			// Take average
			int grad = (ch1Grad + ch2Grad + ch3Grad + 2) / 3;

			gradImg[i*width + j] = grad;
			grads[grad]++;
		} //end-for
	} //end-for

	Mat gradImage = Mat(height, width, CV_16SC1, gradImg);
	imwrite("newGrad.pgm", gradImage);

	// Compute probability function H
	int size = (width - 2)*(height - 2);
	//  size -= grads[0];
	
	for (int i = maxGradValue - 1; i>0; i--) 
		grads[i - 1] += grads[i];
	
	for (int i = 0; i<maxGradValue; i++) 
		H[i] = (double)grads[i] / ((double)size);

	// Compute np: # of segment pieces
	np = 0;
	for (int i = 0; i<segments.size(); i++) {
		int len = (int)segments[i].size();
		np += (len*(len - 1)) / 2;
	} //end-for

	// Validate segments
	for (int i = 0; i< segments.size(); i++) {
		testSegment(i, 0, (int)segments[i].size() - 1);
	} //end-for

	// clear space
	delete[] H;
	delete[] grads;
}